

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O2

void duckdb::RadixScatterStringVector
               (UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t prefix_len,
               idx_t offset)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  bool bVar3;
  idx_t s;
  ulong uVar4;
  ulong uVar5;
  idx_t i;
  idx_t iVar6;
  undefined3 in_register_00000081;
  undefined4 uVar7;
  undefined4 in_register_00000084;
  undefined3 in_register_00000089;
  idx_t iVar8;
  long lVar9;
  string_t value;
  string_t value_00;
  
  uVar7 = CONCAT31(in_register_00000081,desc);
  pdVar1 = vdata->data;
  if (CONCAT31(in_register_00000089,has_null) == 0) {
    for (uVar4 = 0; uVar4 != add_count; uVar4 = uVar4 + 1) {
      uVar5 = uVar4;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)sel->sel_vector[uVar4];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        uVar5 = (ulong)psVar2[uVar5];
      }
      value_00.value.pointer.ptr = (char *)prefix_len;
      value_00.value._0_8_ = *(undefined8 *)(pdVar1 + uVar5 * 0x10 + offset * 0x10 + 8);
      Radix::EncodeStringDataPrefix
                ((Radix *)key_locations[uVar4],
                 *(data_ptr_t *)(pdVar1 + uVar5 * 0x10 + offset * 0x10),value_00,
                 CONCAT44(in_register_00000084,uVar7));
      if (desc) {
        for (iVar6 = 0; prefix_len != iVar6; iVar6 = iVar6 + 1) {
          key_locations[uVar4][iVar6] = ~key_locations[uVar4][iVar6];
        }
      }
      key_locations[uVar4] = key_locations[uVar4] + prefix_len;
    }
  }
  else {
    for (iVar6 = 0; iVar6 != add_count; iVar6 = iVar6 + 1) {
      iVar8 = iVar6;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar8 = (idx_t)sel->sel_vector[iVar6];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar2[iVar8];
      }
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,
                         iVar8 + offset);
      if (bVar3) {
        *key_locations[iVar6] = nulls_first;
        lVar9 = (iVar8 + offset) * 0x10;
        value.value.pointer.ptr = (char *)prefix_len;
        value.value._0_8_ = *(undefined8 *)(pdVar1 + lVar9 + 8);
        Radix::EncodeStringDataPrefix
                  ((Radix *)(key_locations[iVar6] + 1),*(data_ptr_t *)(pdVar1 + lVar9),value,
                   CONCAT44(in_register_00000084,uVar7));
        if (desc) {
          for (uVar4 = 1; uVar4 < prefix_len + 1; uVar4 = uVar4 + 1) {
            key_locations[iVar6][uVar4] = ~key_locations[iVar6][uVar4];
          }
        }
      }
      else {
        *key_locations[iVar6] = !nulls_first;
        switchD_004a0b15::default(key_locations[iVar6] + 1,0,prefix_len);
      }
      key_locations[iVar6] = key_locations[iVar6] + prefix_len + 1;
    }
  }
  return;
}

Assistant:

void RadixScatterStringVector(UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                              data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                              const idx_t prefix_len, idx_t offset) {
	auto source = UnifiedVectorFormat::GetData<string_t>(vdata);
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
				Radix::EncodeStringDataPrefix(key_locations[i] + 1, source[source_idx], prefix_len);
				// invert bits if desc
				if (desc) {
					for (idx_t s = 1; s < prefix_len + 1; s++) {
						*(key_locations[i] + s) = ~*(key_locations[i] + s);
					}
				}
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', prefix_len);
			}
			key_locations[i] += prefix_len + 1;
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write value
			Radix::EncodeStringDataPrefix(key_locations[i], source[source_idx], prefix_len);
			// invert bits if desc
			if (desc) {
				for (idx_t s = 0; s < prefix_len; s++) {
					*(key_locations[i] + s) = ~*(key_locations[i] + s);
				}
			}
			key_locations[i] += prefix_len;
		}
	}
}